

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O1

gdImagePtr gdImageCreateFromGd(FILE *inFile)

{
  gdIOCtx *in;
  gdImagePtr pgVar1;
  
  in = gdNewFileCtx(inFile);
  if (in == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromGdCtx(in);
    (*in->gd_free)(in);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd (FILE * inFile)
{
	gdImagePtr im;
	gdIOCtx *in;

	in = gdNewFileCtx (inFile);
	if (in == NULL) return NULL;
	im = gdImageCreateFromGdCtx (in);

	in->gd_free (in);

	return im;
}